

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadRegionsBuilder.cpp
# Opt level: O2

void __thiscall ThreadRegionsBuilder::clear(ThreadRegionsBuilder *this)

{
  ThreadRegion *pTVar1;
  _Base_ptr p_Var2;
  unordered_map<Node_*,_ThreadRegion_*,_std::hash<Node_*>,_std::equal_to<Node_*>,_std::allocator<std::pair<Node_*const,_ThreadRegion_*>_>_>
  *__range1;
  __node_base *p_Var3;
  
  p_Var3 = &(this->visitedNodeToRegionMap)._M_h._M_before_begin;
  while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
    pTVar1 = *(ThreadRegion **)&((_Prime_rehash_policy *)(p_Var3 + 2))->_M_max_load_factor;
    if (pTVar1 != (ThreadRegion *)0x0) {
      ThreadRegion::~ThreadRegion(pTVar1);
    }
    operator_delete(pTVar1,0xa0);
  }
  p_Var3 = &(this->examinedNodeToRegionMap)._M_h._M_before_begin;
  while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
    pTVar1 = *(ThreadRegion **)&((_Prime_rehash_policy *)(p_Var3 + 2))->_M_max_load_factor;
    if (pTVar1 != (ThreadRegion *)0x0) {
      ThreadRegion::~ThreadRegion(pTVar1);
    }
    operator_delete(pTVar1,0xa0);
  }
  clearComputingData(this);
  for (p_Var2 = (this->threadRegions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->threadRegions_)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    pTVar1 = *(ThreadRegion **)(p_Var2 + 1);
    if (pTVar1 != (ThreadRegion *)0x0) {
      ThreadRegion::~ThreadRegion(pTVar1);
    }
    operator_delete(pTVar1,0xa0);
  }
  std::
  _Rb_tree<ThreadRegion_*,_ThreadRegion_*,_std::_Identity<ThreadRegion_*>,_std::less<ThreadRegion_*>,_std::allocator<ThreadRegion_*>_>
  ::clear(&(this->threadRegions_)._M_t);
  return;
}

Assistant:

void ThreadRegionsBuilder::clear() {
    for (auto iterator : visitedNodeToRegionMap) {
        delete iterator.second;
    }

    for (auto iterator : examinedNodeToRegionMap) {
        delete iterator.second;
    }

    clearComputingData();

    for (auto *iterator : threadRegions_) {
        delete iterator;
    }

    threadRegions_.clear();
}